

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O0

void my_numbox_label_font(t_my_numbox *x,t_symbol *s,int ac,t_atom *av)

{
  t_float tVar1;
  uint local_2c;
  int f;
  t_atom *av_local;
  int ac_local;
  t_symbol *s_local;
  t_my_numbox *x_local;
  
  tVar1 = atom_getfloatarg(1,ac,av);
  local_2c = (uint)tVar1;
  if ((int)local_2c < 4) {
    local_2c = 4;
  }
  (x->x_gui).x_fontsize = local_2c;
  tVar1 = atom_getfloatarg(0,ac,av);
  local_2c = (uint)tVar1;
  if (((int)local_2c < 0) || (2 < (int)local_2c)) {
    local_2c = 0;
  }
  (x->x_gui).x_fsf = (t_iem_fstyle_flags)((uint)(x->x_gui).x_fsf & 0xffffffc0 | local_2c & 0x3f);
  my_numbox_calc_fontwidth(x);
  iemgui_label_font(x,&x->x_gui,s,ac,av);
  return;
}

Assistant:

static void my_numbox_label_font(t_my_numbox *x,
    t_symbol *s, int ac, t_atom *av)
{
    int f = (int)atom_getfloatarg(1, ac, av);

    if(f < 4)
        f = 4;
    x->x_gui.x_fontsize = f;
    f = (int)atom_getfloatarg(0, ac, av);
    if((f < 0) || (f > 2))
        f = 0;
    x->x_gui.x_fsf.x_font_style = f;
    my_numbox_calc_fontwidth(x);
    iemgui_label_font((void *)x, &x->x_gui, s, ac, av);
}